

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

static_huffman_data_model * __thiscall
crnd::static_huffman_data_model::operator=
          (static_huffman_data_model *this,static_huffman_data_model *rhs)

{
  bool bVar1;
  decoder_tables *pdVar2;
  static_huffman_data_model *rhs_local;
  static_huffman_data_model *this_local;
  
  if (this != rhs) {
    this->m_total_syms = rhs->m_total_syms;
    vector<unsigned_char>::operator=(&this->m_code_sizes,&rhs->m_code_sizes);
    bVar1 = vector<unsigned_char>::get_alloc_failed(&this->m_code_sizes);
    if (bVar1) {
      clear(this);
    }
    else if (rhs->m_pDecode_tables == (decoder_tables *)0x0) {
      crnd_delete<crnd::prefix_coding::decoder_tables>(this->m_pDecode_tables);
      this->m_pDecode_tables = (decoder_tables *)0x0;
    }
    else if (this->m_pDecode_tables == (decoder_tables *)0x0) {
      pdVar2 = crnd_new<crnd::prefix_coding::decoder_tables>(rhs->m_pDecode_tables);
      this->m_pDecode_tables = pdVar2;
    }
    else {
      prefix_coding::decoder_tables::operator=(this->m_pDecode_tables,rhs->m_pDecode_tables);
    }
  }
  return this;
}

Assistant:

static_huffman_data_model& static_huffman_data_model::operator=(const static_huffman_data_model& rhs)
    {
        if (this == &rhs)
            return *this;

        m_total_syms = rhs.m_total_syms;
        m_code_sizes = rhs.m_code_sizes;
        if (m_code_sizes.get_alloc_failed())
        {
            clear();
            return *this;
        }

        if (rhs.m_pDecode_tables)
        {
            if (m_pDecode_tables)
                *m_pDecode_tables = *rhs.m_pDecode_tables;
            else
                m_pDecode_tables = crnd_new<prefix_coding::decoder_tables>(*rhs.m_pDecode_tables);
        }
        else
        {
            crnd_delete(m_pDecode_tables);
            m_pDecode_tables = NULL;
        }

        return *this;
    }